

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gopher.c
# Opt level: O1

CURLcode gopher_do(connectdata *conn,_Bool *done)

{
  curl_socket_t sockfd;
  Curl_easy *data;
  CURLcode CVar1;
  int iVar2;
  size_t sVar3;
  size_t len_00;
  size_t sVar4;
  char *newp;
  char *pcVar5;
  size_t sVar6;
  char *sel;
  size_t len;
  ssize_t amount;
  char *local_58;
  size_t local_50;
  size_t local_48;
  curl_off_t *local_40;
  char *local_38;
  
  data = conn->data;
  sockfd = conn->sock[0];
  pcVar5 = (data->state).path;
  local_58 = (char *)0x0;
  *done = true;
  sVar3 = strlen(pcVar5);
  if (sVar3 < 3) {
    local_58 = "";
    local_50 = 0;
    local_38 = (char *)0x0;
  }
  else {
    pcVar5 = pcVar5 + 2;
    sVar3 = strlen(pcVar5);
    if (sVar3 != 0) {
      sVar4 = 0;
      do {
        if (pcVar5[sVar4] == '?') {
          pcVar5[sVar4] = '\t';
        }
        sVar4 = sVar4 + 1;
      } while (sVar3 != sVar4);
    }
    CVar1 = Curl_urldecode(data,pcVar5,0,&local_58,&local_50,false);
    local_38 = local_58;
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
  }
  local_40 = &(data->req).bytecount;
  len_00 = curlx_uztosz(local_50);
  while( true ) {
    CVar1 = Curl_write(conn,sockfd,local_58,len_00,(ssize_t *)&local_48);
    if ((CVar1 != CURLE_OK) ||
       (CVar1 = Curl_client_write(conn,2,local_58,local_48), CVar1 != CURLE_OK)) goto LAB_00137f87;
    local_58 = local_58 + local_48;
    sVar6 = len_00 - local_48;
    if (sVar6 == 0 || (long)len_00 < (long)local_48) break;
    iVar2 = Curl_socket_check(-1,-1,sockfd,100);
    len_00 = sVar6;
    if (iVar2 < 0) {
      CVar1 = CURLE_SEND_ERROR;
LAB_00137f87:
      (*Curl_cfree)(local_38);
      if (CVar1 == CURLE_OK) {
        CVar1 = Curl_sendf(sockfd,conn,"\r\n");
      }
      if (CVar1 == CURLE_OK) {
        CVar1 = Curl_client_write(conn,2,"\r\n",2);
        if (CVar1 == CURLE_OK) {
          CVar1 = CURLE_OK;
          Curl_setup_transfer(conn,0,-1,false,local_40,-1,(curl_off_t *)0x0);
        }
      }
      else {
        Curl_failf(data,"Failed sending Gopher request");
      }
      return CVar1;
    }
  }
  CVar1 = CURLE_OK;
  goto LAB_00137f87;
}

Assistant:

static CURLcode gopher_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];

  curl_off_t *bytecount = &data->req.bytecount;
  char *path = data->state.path;
  char *sel = NULL;
  char *sel_org = NULL;
  ssize_t amount, k;
  size_t len;

  *done = TRUE; /* unconditionally */

  /* Create selector. Degenerate cases: / and /1 => convert to "" */
  if(strlen(path) <= 2) {
    sel = (char *)"";
    len = (int)strlen(sel);
  }
  else {
    char *newp;
    size_t j, i;

    /* Otherwise, drop / and the first character (i.e., item type) ... */
    newp = path;
    newp += 2;

    /* ... then turn ? into TAB for search servers, Veronica, etc. ... */
    j = strlen(newp);
    for(i = 0; i<j; i++)
      if(newp[i] == '?')
        newp[i] = '\x09';

    /* ... and finally unescape */
    result = Curl_urldecode(data, newp, 0, &sel, &len, FALSE);
    if(result)
      return result;
    sel_org = sel;
  }

  /* We use Curl_write instead of Curl_sendf to make sure the entire buffer is
     sent, which could be sizeable with long selectors. */
  k = curlx_uztosz(len);

  for(;;) {
    result = Curl_write(conn, sockfd, sel, k, &amount);
    if(!result) { /* Which may not have written it all! */
      result = Curl_client_write(conn, CLIENTWRITE_HEADER, sel, amount);
      if(result)
        break;

      k -= amount;
      sel += amount;
      if(k < 1)
        break; /* but it did write it all */
    }
    else
      break;

    /* Don't busyloop. The entire loop thing is a work-around as it causes a
       BLOCKING behavior which is a NO-NO. This function should rather be
       split up in a do and a doing piece where the pieces that aren't
       possible to send now will be sent in the doing function repeatedly
       until the entire request is sent.

       Wait a while for the socket to be writable. Note that this doesn't
       acknowledge the timeout.
    */
    if(SOCKET_WRITABLE(sockfd, 100) < 0) {
      result = CURLE_SEND_ERROR;
      break;
    }
  }

  free(sel_org);

  if(!result)
    /* We can use Curl_sendf to send the terminal \r\n relatively safely and
       save allocing another string/doing another _write loop. */
    result = Curl_sendf(sockfd, conn, "\r\n");
  if(result) {
    failf(data, "Failed sending Gopher request");
    return result;
  }
  result = Curl_client_write(conn, CLIENTWRITE_HEADER, (char *)"\r\n", 2);
  if(result)
    return result;

  Curl_setup_transfer(conn, FIRSTSOCKET, -1, FALSE, bytecount,
                      -1, NULL); /* no upload */
  return CURLE_OK;
}